

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O3

void ReadUserInfo(FSerializer *arc,userinfo_t *info,FString *skin)

{
  FBaseCVar *this;
  Node *pNVar1;
  bool bVar2;
  uint uVar3;
  int team;
  UCVarValue in_RAX;
  char *text;
  Node *pNVar4;
  char *str;
  UCVarValue local_38;
  
  local_38 = in_RAX;
  userinfo_t::Reset(info);
  FString::operator=(skin,(char *)0x0);
  bVar2 = FSerializer::BeginObject(arc,"userinfo");
  if (bVar2) {
    text = FSerializer::GetKey(arc);
    while (text != (char *)0x0) {
      FSerializer::StringPtr(arc,(char *)0x0,&local_38.String);
      uVar3 = FName::NameManager::FindName(&FName::NameData,text,false);
      pNVar1 = (info->super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
               ).Nodes + ((info->
                          super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                          ).Size - 1 & uVar3);
      do {
        pNVar4 = pNVar1;
        if ((pNVar4 == (Node *)0x0) || (pNVar4->Next == (Node *)0x1)) goto LAB_00373f9f;
        pNVar1 = pNVar4->Next;
      } while ((pNVar4->Pair).Key.Index != uVar3);
      this = (pNVar4->Pair).Value;
      if (this != (FBaseCVar *)0x0) {
        if (uVar3 == 0x23c) {
          userinfo_t::PlayerClassChanged(info,local_38.String);
        }
        else if (uVar3 == 0x208) {
          FString::operator=(skin,local_38.String);
        }
        else if (uVar3 == 0x203) {
          team = atoi(local_38.String);
          userinfo_t::TeamChanged(info,team);
        }
        else {
          FBaseCVar::SetGenericRep(this,local_38,CVAR_String);
        }
      }
LAB_00373f9f:
      text = FSerializer::GetKey(arc);
    }
    FSerializer::EndObject(arc);
  }
  return;
}

Assistant:

void ReadUserInfo(FSerializer &arc, userinfo_t &info, FString &skin)
{
	FName name;
	FBaseCVar **cvar;
	UCVarValue val;
	const char *key;
	const char *str;

	info.Reset();
	skin = NULL;
	if (arc.BeginObject("userinfo"))
	{
		while ((key = arc.GetKey()))
		{
			arc.StringPtr(nullptr, str);
			name = key;
			cvar = info.CheckKey(name);
			if (cvar != NULL && *cvar != NULL)
			{
				switch (name)
				{
				case NAME_Team:			info.TeamChanged(atoi(str)); break;
				case NAME_Skin:			skin = str; break;	// Caller must call SkinChanged() once current calss is known
				case NAME_PlayerClass:	info.PlayerClassChanged(str); break;
				default:
					val.String = str;
					(*cvar)->SetGenericRep(val, CVAR_String);
					break;
				}
			}
		}
		arc.EndObject();
	}
}